

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_msg.c
# Opt level: O3

void nni_http_req_init(nni_http_req *req)

{
  nni_list_init_offset(&(req->data).hdrs,0x10);
  (req->data).own = false;
  (req->data).data = (char *)0x0;
  (req->data).size = 0;
  (req->data).buf = (char *)0x0;
  (req->data).bufsz = 0;
  return;
}

Assistant:

void
nni_http_req_init(nni_http_req *req)
{
	NNI_LIST_INIT(&req->data.hdrs, http_header, node);
	req->data.buf   = NULL;
	req->data.bufsz = 0;
	req->data.data  = NULL;
	req->data.size  = 0;
	req->data.own   = false;
}